

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper<long_long,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase1
               (unsigned_long_long lhs,
               SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  bool bVar1;
  longlong lVar2;
  undefined8 *in_RDX;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_RDI;
  unsigned_long_long *in_stack_ffffffffffffffa8;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  *in_stack_ffffffffffffffb0;
  undefined8 local_40;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  *in_stack_ffffffffffffffd8;
  
  lVar2 = ::SafeInt::operator_cast_to_long_long(in_stack_ffffffffffffffb0);
  if (lVar2 < 1) {
    lVar2 = ::SafeInt::operator_cast_to_long_long(in_stack_ffffffffffffffb0);
    if (lVar2 == 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    bVar1 = DivisionNegativeCornerCaseHelper<long_long,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
            ::NegativeCornerCase((unsigned_long_long)in_RDX,in_RDI,in_stack_ffffffffffffffd8);
    if (!bVar1) {
      ::SafeInt::operator_cast_to_long_long(in_stack_ffffffffffffffb0);
      SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<unsigned_long_long>(in_stack_ffffffffffffffb0,(unsigned_long_long *)in_RDI.m_int);
      *in_RDX = local_40;
    }
  }
  else {
    ::SafeInt::operator_cast_to_long_long
              ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               in_RDI.m_int);
    SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
    SafeInt<unsigned_long_long>
              ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               in_RDI.m_int,in_stack_ffffffffffffffa8);
    *in_RDX = in_stack_ffffffffffffffd8;
  }
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }